

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetCurrentFont(ImFont *font)

{
  undefined1 auVar1 [16];
  ImGuiContext *pIVar2;
  float fVar3;
  
  pIVar2 = GImGui;
  GImGui->Font = font;
  auVar1 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),
                      ZEXT416((uint)((pIVar2->IO).FontGlobalScale * font->FontSize * font->Scale)));
  pIVar2->FontBaseSize = auVar1._0_4_;
  if (pIVar2->CurrentWindow == (ImGuiWindow *)0x0) {
    fVar3 = 0.0;
  }
  else {
    fVar3 = ImGuiWindow::CalcFontSize(pIVar2->CurrentWindow);
    font = pIVar2->Font;
  }
  pIVar2->FontSize = fVar3;
  (pIVar2->DrawListSharedData).TexUvWhitePixel = font->ContainerAtlas->TexUvWhitePixel;
  (pIVar2->DrawListSharedData).Font = font;
  (pIVar2->DrawListSharedData).FontSize = fVar3;
  return;
}

Assistant:

void ImGui::SetCurrentFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(font && font->IsLoaded());    // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(font->Scale > 0.0f);
    g.Font = font;
    g.FontBaseSize = ImMax(1.0f, g.IO.FontGlobalScale * g.Font->FontSize * g.Font->Scale);
    g.FontSize = g.CurrentWindow ? g.CurrentWindow->CalcFontSize() : 0.0f;

    ImFontAtlas* atlas = g.Font->ContainerAtlas;
    g.DrawListSharedData.TexUvWhitePixel = atlas->TexUvWhitePixel;
    g.DrawListSharedData.Font = g.Font;
    g.DrawListSharedData.FontSize = g.FontSize;
}